

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::Stmt::remove_from_parent(Stmt *this)

{
  IRNodeKind IVar1;
  Generator *this_00;
  StmtException *this_01;
  Generator *gen;
  initializer_list<kratos::IRNode_*> __l;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_68;
  Stmt *local_50;
  string local_48;
  allocator<char> local_22;
  allocator_type local_21;
  
  this_00 = (Generator *)this->parent_;
  if (this_00 != (Generator *)0x0) {
    IVar1 = (this_00->super_IRNode).ast_node_type_;
    if (IVar1 == StmtKind) {
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<kratos::Stmt>);
      (*(this_00->super_IRNode)._vptr_IRNode[10])(this_00,&local_48);
    }
    else {
      if (IVar1 != GeneratorKind) {
        this_01 = (StmtException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Statement parent is null",&local_22);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_50;
        local_50 = this;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_68,__l,&local_21);
        StmtException::StmtException(this_01,&local_48,&local_68);
        __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<kratos::Stmt>);
      Generator::remove_stmt(this_00,(shared_ptr<kratos::Stmt> *)&local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  }
  return;
}

Assistant:

void Stmt::remove_from_parent() {
    if (!parent_) return;
    if (parent_->ir_node_kind() == IRNodeKind::GeneratorKind) {
        auto *gen = reinterpret_cast<Generator *>(parent_);
        gen->remove_stmt(shared_from_this());
    } else if (parent_->ir_node_kind() == IRNodeKind::StmtKind) {
        auto *stmt = reinterpret_cast<Stmt *>(parent_);
        stmt->remove_stmt(shared_from_this());
    } else {
        throw StmtException("Statement parent is null", {this});
    }
}